

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void ProjectOrigin(btVector3 *a,btVector3 *b,btVector3 *c,btVector3 *prj,btScalar *sqd)

{
  btScalar *in_RCX;
  float *in_R8;
  btScalar bVar1;
  btVector3 bVar2;
  btVector3 p;
  btScalar k2;
  btScalar k;
  btVector3 n;
  btScalar m2;
  btVector3 *q;
  btVector3 *in_stack_fffffffffffffeb8;
  btVector3 *v2;
  btVector3 *in_stack_fffffffffffffec0;
  btVector3 *v1;
  btVector3 *in_stack_fffffffffffffec8;
  btVector3 *v2_00;
  uint7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar3;
  btScalar *local_100;
  btVector3 in_stack_ffffffffffffff10;
  btVector3 *in_stack_ffffffffffffff20;
  btVector3 local_90;
  float local_80;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74 [4];
  btScalar local_64;
  btScalar local_60 [4];
  btScalar local_50 [4];
  btScalar local_40 [4];
  btScalar *local_30;
  float *local_28;
  btScalar *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_50 = (btScalar  [4])
             operator-((btVector3 *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8);
  local_60 = (btScalar  [4])
             operator-((btVector3 *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8);
  local_40 = (btScalar  [4])btCross(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_30 = local_40;
  local_64 = btVector3::length2((btVector3 *)0x280e81);
  if (1.1920929e-07 < local_64) {
    local_78 = btSqrt(0.0);
    local_74 = (btScalar  [4])
               operator/(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_floats);
    local_7c = btDot(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_80 = local_7c * local_7c;
    if (local_80 < *local_28) {
      local_90 = operator*((btVector3 *)
                           CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                           in_stack_fffffffffffffec8->m_floats);
      v2_00 = &local_90;
      operator-((btVector3 *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),v2_00);
      operator-((btVector3 *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),v2_00);
      btCross(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      bVar1 = btDot(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      uVar3 = false;
      if (0.0 < bVar1) {
        v1 = &local_90;
        bVar2 = operator-((btVector3 *)(ulong)in_stack_fffffffffffffed0,v2_00);
        in_stack_ffffffffffffff20 = bVar2.m_floats._0_8_;
        in_stack_ffffffffffffff10 =
             operator-((btVector3 *)CONCAT17(uVar3,in_stack_fffffffffffffed0),v2_00);
        btCross(v1,in_stack_fffffffffffffeb8);
        bVar1 = btDot(v1,in_stack_fffffffffffffeb8);
        uVar3 = false;
        if (0.0 < bVar1) {
          v2 = &local_90;
          operator-((btVector3 *)(ulong)in_stack_fffffffffffffed0,v2_00);
          operator-((btVector3 *)CONCAT17(uVar3,in_stack_fffffffffffffed0),v2_00);
          bVar2 = btCross(v1,v2);
          local_100 = bVar2.m_floats._8_8_;
          bVar1 = btDot(v1,v2);
          uVar3 = 0.0 < bVar1;
        }
      }
      if ((bool)uVar3 == false) {
        ProjectOrigin(in_stack_ffffffffffffff20,in_stack_ffffffffffffff10.m_floats._8_8_,
                      in_stack_ffffffffffffff10.m_floats._0_8_,local_100);
        ProjectOrigin(in_stack_ffffffffffffff20,in_stack_ffffffffffffff10.m_floats._8_8_,
                      in_stack_ffffffffffffff10.m_floats._0_8_,local_100);
        ProjectOrigin(in_stack_ffffffffffffff20,in_stack_ffffffffffffff10.m_floats._8_8_,
                      in_stack_ffffffffffffff10.m_floats._0_8_,local_100);
      }
      else {
        *(undefined8 *)local_20 = local_90.m_floats._0_8_;
        *(undefined8 *)(local_20 + 2) = local_90.m_floats._8_8_;
        *local_28 = local_80;
      }
    }
  }
  return;
}

Assistant:

static inline void			ProjectOrigin(	const btVector3& a,
										  const btVector3& b,
										  const btVector3& c,
										  btVector3& prj,
										  btScalar& sqd)
{
	const btVector3&	q=btCross(b-a,c-a);
	const btScalar		m2=q.length2();
	if(m2>SIMD_EPSILON)
	{
		const btVector3	n=q/btSqrt(m2);
		const btScalar	k=btDot(a,n);
		const btScalar	k2=k*k;
		if(k2<sqd)
		{
			const btVector3	p=n*k;
			if(	(btDot(btCross(a-p,b-p),q)>0)&&
				(btDot(btCross(b-p,c-p),q)>0)&&
				(btDot(btCross(c-p,a-p),q)>0))
			{			
				prj=p;
				sqd=k2;
			}
			else
			{
				ProjectOrigin(a,b,prj,sqd);
				ProjectOrigin(b,c,prj,sqd);
				ProjectOrigin(c,a,prj,sqd);
			}
		}
	}
}